

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

bool __thiscall miniply::PLYReader::load_ascii_list_property(PLYReader *this,PLYProperty *prop)

{
  uint uVar1;
  iterator __position;
  bool bVar2;
  ulong in_RAX;
  uint uVar3;
  long lVar4;
  int count;
  undefined8 local_38;
  
  local_38 = in_RAX & 0xffffffff00000000;
  if ((((int)prop->countType < 6) && (bVar2 = int_literal(this,(int *)&local_38), bVar2)) &&
     (bVar2 = advance(this), bVar2)) {
    bVar2 = -1 < (int)(uint)local_38;
  }
  else {
    bVar2 = false;
  }
  this->m_valid = bVar2;
  if (bVar2 == false) {
LAB_0010616b:
    bVar2 = false;
  }
  else {
    uVar1 = *(uint *)(kPLYPropertySize + (ulong)prop->type * 4);
    lVar4 = (long)(prop->listData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(prop->listData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_38 = CONCAT44((uint)local_38,(uint)local_38);
    __position._M_current =
         (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&prop->rowCount,__position,(uint *)((long)&local_38 + 4));
    }
    else {
      *__position._M_current = (uint)local_38;
      (prop->rowCount).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&prop->listData,(long)(int)(uint)local_38 * (ulong)uVar1 + lVar4);
    bVar2 = (uint)local_38 == 0;
    if (!bVar2) {
      uVar3 = 0;
      do {
        bVar2 = ascii_value(this,prop->type,
                            (prop->listData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar4);
        if (!bVar2) {
          this->m_valid = false;
          goto LAB_0010616b;
        }
        lVar4 = lVar4 + (ulong)uVar1;
        uVar3 = uVar3 + 1;
        bVar2 = uVar3 >= (uint)local_38;
      } while (uVar3 < (uint)local_38);
    }
  }
  return bVar2;
}

Assistant:

bool PLYReader::load_ascii_list_property(PLYProperty& prop)
  {
    int count = 0;
    m_valid = (prop.countType < PLYPropertyType::Float) && int_literal(&count) && advance() && (count >= 0);
    if (!m_valid) {
      return false;
    }

    const size_t numBytes = kPLYPropertySize[uint32_t(prop.type)];

    size_t back = prop.listData.size();
    prop.rowCount.push_back(static_cast<uint32_t>(count));
    prop.listData.resize(back + numBytes * size_t(count));

    for (uint32_t i = 0; i < uint32_t(count); i++) {
      if (!ascii_value(prop.type, prop.listData.data() + back)) {
        m_valid = false;
        return false;
      }
      back += numBytes;
    }

    return true;
  }